

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  QueryPlan *this;
  int __oflag;
  int __fd;
  QueryPlan *query_plan;
  char **argv_local;
  int argc_local;
  
  this = compileQuery();
  QueryPlan::open(this,(char *)argv,__oflag);
  __fd = (int)argv;
  QueryPlan::printResultSet(this);
  QueryPlan::close(this,__fd);
  if (this != (QueryPlan *)0x0) {
    operator_delete(this,8);
  }
  return 0;
}

Assistant:

int main(int argc, char*argv[]) {
    QueryPlan *query_plan = compileQuery();
    // QueryPlan *query_plan = compileQueryWithJit();
    query_plan->open();
    query_plan->printResultSet();
    query_plan->close();
    delete query_plan;
}